

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu.c
# Opt level: O1

MPP_RET vdpu_av1d_deinit(void *hal)

{
  int iVar1;
  VdpuAv1dRegCtx *ctx;
  MPP_RET MVar2;
  undefined8 in_RAX;
  VdpuAv1dRegSet **ppVVar3;
  ulong uVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  
  ctx = *(VdpuAv1dRegCtx **)((long)hal + 0x50);
  iVar1 = *(int *)((long)hal + 0x58);
  ppVVar3 = &ctx->reg_buf[0].regs;
  uVar4 = 0;
  do {
    if (*ppVVar3 != (VdpuAv1dRegSet *)0x0) {
      mpp_osal_free("hal_av1d_release_res",*ppVVar3);
    }
    uVar7 = (undefined4)((ulong)in_RAX >> 0x20);
    *ppVVar3 = (VdpuAv1dRegSet *)0x0;
    if (iVar1 == 0) break;
    ppVVar3 = ppVVar3 + 2;
    bVar5 = uVar4 < 2;
    uVar4 = uVar4 + 1;
  } while (bVar5);
  if (ctx->prob_tbl_base != (MppBuffer)0x0) {
    MVar2 = mpp_buffer_put_with_caller(ctx->prob_tbl_base,"hal_av1d_release_res");
    if (MVar2 != MPP_OK) {
      if (((byte)hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf2);
      }
      if (((byte)hal_av1d_debug & 2) != 0) {
        uVar6 = CONCAT44(uVar7,0xf2);
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",uVar6);
        uVar7 = (undefined4)((ulong)uVar6 >> 0x20);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00218a93;
      }
    }
  }
  if (ctx->prob_tbl_out_base != (MppBuffer)0x0) {
    MVar2 = mpp_buffer_put_with_caller(ctx->prob_tbl_out_base,"hal_av1d_release_res");
    if (MVar2 != MPP_OK) {
      if (((byte)hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf3);
      }
      if (((byte)hal_av1d_debug & 2) != 0) {
        uVar6 = CONCAT44(uVar7,0xf3);
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",uVar6);
        uVar7 = (undefined4)((ulong)uVar6 >> 0x20);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00218a93;
      }
    }
  }
  if (ctx->tile_info != (MppBuffer)0x0) {
    MVar2 = mpp_buffer_put_with_caller(ctx->tile_info,"hal_av1d_release_res");
    if (MVar2 != MPP_OK) {
      if (((byte)hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf4);
      }
      if (((byte)hal_av1d_debug & 2) != 0) {
        uVar6 = CONCAT44(uVar7,0xf4);
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",uVar6);
        uVar7 = (undefined4)((ulong)uVar6 >> 0x20);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00218a93;
      }
    }
  }
  if (ctx->film_grain_mem != (MppBuffer)0x0) {
    MVar2 = mpp_buffer_put_with_caller(ctx->film_grain_mem,"hal_av1d_release_res");
    if (MVar2 != MPP_OK) {
      if (((byte)hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf5);
      }
      if (((byte)hal_av1d_debug & 2) != 0) {
        uVar6 = CONCAT44(uVar7,0xf5);
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",uVar6);
        uVar7 = (undefined4)((ulong)uVar6 >> 0x20);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00218a93;
      }
    }
  }
  if (ctx->global_model != (MppBuffer)0x0) {
    MVar2 = mpp_buffer_put_with_caller(ctx->global_model,"hal_av1d_release_res");
    if (MVar2 != MPP_OK) {
      if (((byte)hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf6);
      }
      if (((byte)hal_av1d_debug & 2) != 0) {
        uVar6 = CONCAT44(uVar7,0xf6);
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",uVar6);
        uVar7 = (undefined4)((ulong)uVar6 >> 0x20);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00218a93;
      }
    }
  }
  if (ctx->tile_buf != (MppBuffer)0x0) {
    MVar2 = mpp_buffer_put_with_caller(ctx->tile_buf,"hal_av1d_release_res");
    if (MVar2 != MPP_OK) {
      if (((byte)hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf7);
      }
      if (((byte)hal_av1d_debug & 2) != 0) {
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",CONCAT44(uVar7,0xf7));
        if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00218a93:
          abort();
        }
      }
    }
  }
  vdpu_av1d_filtermem_release(ctx);
  hal_bufs_deinit(ctx->tile_out_bufs);
  if (*(void **)((long)hal + 0x50) != (void *)0x0) {
    mpp_osal_free("hal_av1d_release_res",*(void **)((long)hal + 0x50));
  }
  *(undefined8 *)((long)hal + 0x50) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET vdpu_av1d_deinit(void *hal)
{
    hal_av1d_release_res(hal);

    return MPP_OK;
}